

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Ant * __thiscall
Ant::updatePh(Ant *this,vector<Wall,_std::allocator<Wall>_> *walls,
             vector<Pheromone,_std::allocator<Pheromone>_> *pheromones,
             vector<Gate,_std::allocator<Gate>_> *gates)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Pheromone PVar6;
  ulong uVar7;
  Wall *wall;
  pointer pWVar8;
  pointer pGVar9;
  pointer pPVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  
  iVar1 = this->x;
  uVar2 = this->y;
  iVar11 = -999999;
  iVar12 = 999999;
  uVar13 = 999999;
  uVar14 = 0xfff0bdc1;
  for (pWVar8 = (walls->super__Vector_base<Wall,_std::allocator<Wall>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pWVar8 != (walls->super__Vector_base<Wall,_std::allocator<Wall>_>)._M_impl.
                super__Vector_impl_data._M_finish; pWVar8 = pWVar8 + 1) {
    iVar3 = pWVar8->x;
    uVar4 = pWVar8->y;
    if (iVar3 == iVar1) {
      if ((int)uVar2 < (int)uVar4) {
        if ((int)uVar4 <= (int)uVar13) {
          uVar13 = uVar4;
        }
      }
      else if (((int)uVar4 < (int)uVar2) && ((int)uVar14 < (int)uVar4)) {
        uVar14 = uVar4;
      }
    }
    else if (uVar4 == uVar2) {
      if (iVar1 < iVar3) {
        if (iVar3 <= iVar12) {
          iVar12 = iVar3;
        }
      }
      else if ((iVar3 < iVar1) && (iVar11 < iVar3)) {
        iVar11 = iVar3;
      }
    }
  }
  for (pGVar9 = (gates->super__Vector_base<Gate,_std::allocator<Gate>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pGVar9 != (gates->super__Vector_base<Gate,_std::allocator<Gate>_>)._M_impl.
                super__Vector_impl_data._M_finish; pGVar9 = pGVar9 + 1) {
    iVar3 = pGVar9->x;
    uVar4 = pGVar9->y;
    if (iVar3 == iVar1) {
      if (pGVar9->facing == 1 && (int)uVar2 < (int)uVar4) {
        if ((int)uVar4 <= (int)uVar13) {
          uVar13 = uVar4;
        }
      }
      else if ((pGVar9->facing == 3 && (int)uVar4 < (int)uVar2) && ((int)uVar14 < (int)uVar4)) {
        uVar14 = uVar4;
      }
    }
    else if (uVar4 == uVar2) {
      if (pGVar9->facing == 0 && iVar1 < iVar3) {
        if (iVar3 <= iVar12) {
          iVar12 = iVar3;
        }
      }
      else if ((pGVar9->facing == 2 && iVar3 < iVar1) && (iVar11 < iVar3)) {
        iVar11 = iVar3;
      }
    }
  }
  PVar6.y = 0;
  PVar6.x = iVar1 - 1;
  dVar15 = 999999.0;
  uVar7 = (ulong)uVar2;
  for (pPVar10 = (pheromones->super__Vector_base<Pheromone,_std::allocator<Pheromone>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      pPVar10 !=
      (pheromones->super__Vector_base<Pheromone,_std::allocator<Pheromone>_>)._M_impl.
      super__Vector_impl_data._M_finish; pPVar10 = pPVar10 + 1) {
    iVar3 = pPVar10->x;
    iVar5 = pPVar10->y;
    dVar16 = SQRT((double)(int)(iVar5 - uVar2) * (double)(int)(iVar5 - uVar2) +
                  (double)(iVar3 - iVar1) * (double)(iVar3 - iVar1));
    if ((((0.0 < dVar16) && (dVar16 < dVar15)) && ((int)uVar14 < iVar5)) &&
       (((iVar5 < (int)uVar13 && (iVar11 < iVar3)) && (iVar3 < iVar12)))) {
      PVar6 = *pPVar10;
      uVar7 = (ulong)PVar6 >> 0x20;
      dVar15 = dVar16;
    }
  }
  this->t = (Pheromone)((ulong)PVar6 & 0xffffffff | uVar7 << 0x20);
  iVar12 = 0;
  if (iVar1 <= PVar6.x) {
    if ((int)uVar7 < (int)uVar2) {
      iVar12 = 1;
    }
    else if (iVar1 < PVar6.x) {
      iVar12 = 2;
    }
    else {
      if ((int)uVar7 <= (int)uVar2) {
        return this;
      }
      iVar12 = 3;
    }
  }
  this->direction = iVar12;
  return this;
}

Assistant:

Ant& updatePh(const vector<Wall> & walls, const vector<Pheromone> & pheromones, const vector<Gate> & gates) {
            int upperBound = -999999; int lowerBound = 999999;
            int leftBound = -999999; int rightBound = 999999;

            Pheromone target(x - 1, y);
            double bestDist = 999999;

            for (const Wall & wall : walls) {
                if (wall.x == x) {
                    if (wall.y > y)
                        lowerBound = min(wall.y, lowerBound);
                    else if (wall.y < y)
                        upperBound = max(wall.y, upperBound);
                } else if (wall.y == y) {
                    if (wall.x > x)
                        rightBound = min(wall.x, rightBound);
                    else if (wall.x < x)
                        leftBound = max(wall.x, leftBound);
                }
            }

            for (const Gate & gate : gates) {
                if (gate.x == x) {
                    if (gate.y > y && gate.facing == 1)
                        lowerBound = min(gate.y, lowerBound);
                    else if (gate.y < y && gate.facing == 3)
                        upperBound = max(gate.y, upperBound);
                } else if (gate.y == y) {
                    if (gate.x > x && gate.facing == 0)
                        rightBound = min(gate.x, rightBound);
                    else if (gate.x < x && gate.facing == 2)
                        leftBound = max(gate.x, leftBound);
                }
            }

            for (const Pheromone & pher : pheromones) {
                double d = dist({ pher.x, pher.y }, { x, y });
                if (0 < d && d < bestDist &&
                        upperBound < pher.y && pher.y < lowerBound &&
                        leftBound < pher.x && pher.x < rightBound) {
                    bestDist = d;
                    target = pher;
                }
            }

            this -> t = target;

            if (target.x < x)
                setFacing(0);
            else if (target.y < y)
                setFacing(1);
            else if (x < target.x)
                setFacing(2);
            else if (y < target.y)
                setFacing(3);

            return *this;
        }